

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_contains_range(roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  int iVar2;
  container_t *c;
  _Bool _Var3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  uint8_t uVar9;
  uint uVar10;
  uint16_t *puVar11;
  uint uVar12;
  int iVar13;
  uint32_t range_end_00;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  
  uVar14 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar14 = range_end;
  }
  if (range_start < uVar14) {
    if (uVar14 - range_start == 1) {
      _Var3 = roaring_bitmap_contains(r,(uint)range_start);
      return _Var3;
    }
    lVar15 = uVar14 - 1;
    iVar6 = (int)((ulong)lVar15 >> 0x10);
    iVar5 = (int)(range_start >> 0x10);
    iVar7 = iVar6 - iVar5;
    iVar2 = (r->high_low_container).size;
    if (iVar7 < iVar2) {
      if (iVar2 == 0) {
LAB_0011cace:
        uVar16 = iVar2 - 1;
LAB_0011cad3:
        if (iVar2 != 0) {
          puVar11 = (r->high_low_container).keys;
          goto LAB_0011cadc;
        }
LAB_0011cae4:
        uVar12 = iVar2 - 1;
      }
      else {
        puVar11 = (r->high_low_container).keys;
        uVar4 = (ushort)(range_start >> 0x10);
        if (puVar11[(long)iVar2 + -1] == uVar4) goto LAB_0011cace;
        if (0 < iVar2) {
          iVar13 = iVar2 + -1;
          uVar12 = 0;
          do {
            uVar16 = iVar13 + uVar12 >> 1;
            uVar1 = *(ushort *)((long)puVar11 + (ulong)(iVar13 + uVar12 & 0xfffffffe));
            if (uVar1 < uVar4) {
              uVar12 = uVar16 + 1;
            }
            else {
              if (uVar1 <= uVar4) goto LAB_0011cad3;
              iVar13 = uVar16 - 1;
            }
          } while ((int)uVar12 <= iVar13);
          uVar16 = ~uVar12;
          goto LAB_0011cad3;
        }
        uVar16 = 0xffffffff;
LAB_0011cadc:
        uVar4 = (ushort)((ulong)lVar15 >> 0x10);
        if (puVar11[(long)iVar2 + -1] == uVar4) goto LAB_0011cae4;
        if (iVar2 < 1) {
          uVar12 = 0xffffffff;
        }
        else {
          iVar13 = iVar2 + -1;
          uVar10 = 0;
          do {
            uVar12 = iVar13 + uVar10 >> 1;
            uVar1 = *(ushort *)((long)puVar11 + (ulong)(iVar13 + uVar10 & 0xfffffffe));
            if (uVar1 < uVar4) {
              uVar10 = uVar12 + 1;
            }
            else {
              if (uVar1 <= uVar4) goto LAB_0011cae9;
              iVar13 = uVar12 - 1;
            }
          } while ((int)uVar10 <= iVar13);
          uVar12 = ~uVar10;
        }
      }
LAB_0011cae9:
      if ((int)uVar16 < 0) {
        return false;
      }
      uVar12 = (int)uVar12 >> 0x1f ^ uVar12;
      if (uVar12 - uVar16 != iVar7) {
        return false;
      }
      uVar10 = (uint)range_start & 0xffff;
      range_end_00 = ((uint)lVar15 & 0xffff) + 1;
      uVar9 = (r->high_low_container).typecodes[uVar16 & 0xffff];
      c = (r->high_low_container).containers[uVar16 & 0xffff];
      if (iVar6 == iVar5) {
        _Var3 = container_contains_range(c,uVar10,range_end_00,uVar9);
        return _Var3;
      }
      _Var3 = container_contains_range(c,uVar10,0x10000,uVar9);
      if (_Var3) {
        if (iVar2 <= (int)uVar12) {
          __assert_fail("ie < hlc_sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x450a,
                        "_Bool roaring_bitmap_contains_range(const roaring_bitmap_t *, uint64_t, uint64_t)"
                       );
        }
        _Var3 = container_contains_range
                          ((r->high_low_container).containers[uVar12 & 0xffff],0,range_end_00,
                           (r->high_low_container).typecodes[uVar12 & 0xffff]);
        if (!_Var3) {
          return false;
        }
        uVar16 = uVar16 + 1;
        if ((int)uVar16 < (int)uVar12) {
          do {
            uVar9 = (r->high_low_container).typecodes[uVar16 & 0xffff];
            piVar8 = (int *)(r->high_low_container).containers[uVar16 & 0xffff];
            if (uVar9 == '\x04') {
              uVar9 = (uint8_t)piVar8[2];
              if (uVar9 == '\x04') {
                __assert_fail("*type != SHARED_CONTAINER_TYPE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                              ,0x1062,
                              "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                             );
              }
              piVar8 = *(int **)piVar8;
            }
            if (uVar9 == '\x03') {
              if (*piVar8 != 1) {
                return false;
              }
              if (**(short **)(piVar8 + 2) != 0) {
                return false;
              }
              if ((*(short **)(piVar8 + 2))[1] != -1) goto LAB_0011cc94;
            }
            else {
              if ((uVar9 != '\x02') && (uVar9 != '\x01')) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                              ,0x1110,"_Bool container_is_full(const container_t *, uint8_t)");
              }
              if (*piVar8 != 0x10000) goto LAB_0011cc94;
            }
            uVar16 = uVar16 + 1;
          } while (uVar12 != uVar16);
        }
        goto LAB_0011cc8f;
      }
    }
LAB_0011cc94:
    _Var3 = false;
  }
  else {
LAB_0011cc8f:
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

bool roaring_bitmap_contains_range(const roaring_bitmap_t *r, uint64_t range_start, uint64_t range_end) {
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }
    if (range_start >= range_end) return true;  // empty range are always contained!
    if (range_end - range_start == 1) return roaring_bitmap_contains(r, (uint32_t)range_start);
    uint16_t hb_rs = (uint16_t)(range_start >> 16);
    uint16_t hb_re = (uint16_t)((range_end - 1) >> 16);
    const int32_t span = hb_re - hb_rs;
    const int32_t hlc_sz = ra_get_size(&r->high_low_container);
    if (hlc_sz < span + 1) {
      return false;
    }
    int32_t is = ra_get_index(&r->high_low_container, hb_rs);
    int32_t ie = ra_get_index(&r->high_low_container, hb_re);
    ie = (ie < 0 ? -ie - 1 : ie);
    if ((is < 0) || ((ie - is) != span)) {
       return false;
    }
    const uint32_t lb_rs = range_start & 0xFFFF;
    const uint32_t lb_re = ((range_end - 1) & 0xFFFF) + 1;
    uint8_t type;
    container_t *c = ra_get_container_at_index(&r->high_low_container, is,
                                               &type);
    if (hb_rs == hb_re) {
      return container_contains_range(c, lb_rs, lb_re, type);
    }
    if (!container_contains_range(c, lb_rs, 1 << 16, type)) {
      return false;
    }
    assert(ie < hlc_sz); // would indicate an algorithmic bug
    c = ra_get_container_at_index(&r->high_low_container, ie, &type);
    if (!container_contains_range(c, 0, lb_re, type)) {
        return false;
    }
    for (int32_t i = is + 1; i < ie; ++i) {
        c = ra_get_container_at_index(&r->high_low_container, i, &type);
        if (!container_is_full(c, type) ) {
          return false;
        }
    }
    return true;
}